

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O3

void __thiscall Rml::ElementScroll::FormatScrollbars(ElementScroll *this)

{
  Scrollbar *pSVar1;
  undefined4 uVar2;
  WidgetScroll *pWVar3;
  Element *pEVar4;
  Vector2f _content;
  Vector2f offset_00;
  Vector2f VVar5;
  bool bVar6;
  bool bVar7;
  ComputedValues *pCVar8;
  Box *pBVar9;
  undefined1 auVar10 [8];
  float *pfVar11;
  Vector2f *pVVar12;
  BoxEdge edge;
  ulong uVar13;
  BoxEdge edge_00;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  Vector2f containing_block;
  Box corner_box;
  Vector2f offset;
  Vector2f local_120;
  Vector2f *local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  Box *local_f0;
  undefined1 local_e8 [8];
  undefined8 uStack_e0;
  undefined1 local_d8 [24];
  ElementScroll *local_c0;
  Box local_b8;
  undefined1 local_80 [40];
  undefined8 local_58;
  PropertyDefinition *local_50;
  int local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  uStack_e0 = local_e8;
  local_f0 = Element::GetBox(this->element);
  local_120 = Box::GetSize(local_f0,Padding);
  pVVar12 = &local_120;
  local_d8._8_4_ = extraout_XMM0_Dc;
  local_d8._0_4_ = local_120.x;
  local_d8._4_4_ = local_120.y;
  local_d8._12_4_ = extraout_XMM0_Dd;
  auVar10 = (undefined1  [8])this->scrollbars;
  pfVar11 = (float *)local_80;
  pBVar9 = &local_b8;
  uVar13 = 0;
  local_e8 = auVar10;
  local_c0 = this;
  bVar7 = true;
  do {
    bVar6 = bVar7;
    if (((Scrollbar *)((long)auVar10 + uVar13 * 0x18))->enabled == true) {
      local_108._0_8_ = pBVar9;
      pSVar1 = (Scrollbar *)((long)auVar10 + uVar13 * 0x18);
      pWVar3 = (pSVar1->widget)._M_t.
               super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
               _M_t.
               super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>.
               super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
      local_118 = pVVar12;
      if (bVar6) {
        fVar14 = Element::GetClientHeight(this->element);
        WidgetScroll::SetBarLength(pWVar3,fVar14);
        pWVar3 = (pSVar1->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
        fVar14 = Element::GetScrollHeight(this->element);
        WidgetScroll::SetTrackLength(pWVar3,fVar14);
        fVar14 = Element::GetScrollHeight(this->element);
        fVar15 = Element::GetClientHeight(this->element);
        pWVar3 = (pSVar1->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
        if (fVar14 - fVar15 <= 0.0) {
          fVar16 = 0.0;
        }
        else {
          fVar16 = Element::GetScrollTop(this->element);
          fVar16 = fVar16 / (fVar14 - fVar15);
        }
        WidgetScroll::SetBarPosition(pWVar3,fVar16);
        edge_00 = Right;
        edge = Top;
      }
      else {
        fVar14 = Element::GetClientWidth(this->element);
        WidgetScroll::SetBarLength(pWVar3,fVar14);
        pWVar3 = (pSVar1->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
        fVar14 = Element::GetScrollWidth(this->element);
        WidgetScroll::SetTrackLength(pWVar3,fVar14);
        fVar14 = Element::GetScrollWidth(this->element);
        fVar15 = Element::GetClientWidth(this->element);
        pWVar3 = (pSVar1->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl;
        if (fVar14 - fVar15 <= 0.0) {
          fVar16 = 0.0;
        }
        else {
          fVar16 = Element::GetScrollLeft(this->element);
          fVar16 = fVar16 / (fVar14 - fVar15);
        }
        WidgetScroll::SetBarPosition(pWVar3,fVar16);
        edge_00 = Bottom;
        edge = Left;
      }
      uVar13 = uVar13 ^ 1;
      fVar14 = (&local_120.x)[uVar13];
      pCVar8 = Element::GetComputedValues(pSVar1->element);
      fVar15 = (pCVar8->rare).scrollbar_margin;
      fVar16 = 0.0;
      if (*(char *)((long)local_e8 + 0x10 + uVar13 * 0x18) == '\x01') {
        fVar16 = *(float *)((long)local_e8 + uVar13 * 0x18 + 0x14);
      }
      if (fVar15 <= fVar16) {
        fVar15 = fVar16;
      }
      WidgetScroll::FormatElements
                ((pSVar1->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl,
                 (Vector2f)local_d8._0_8_,fVar14 - fVar15);
      local_80._0_8_ = Box::GetPosition(local_f0,Padding);
      local_118 = (Vector2f *)CONCAT44(local_118._4_4_,local_118->x);
      pBVar9 = Element::GetBox(pSVar1->element);
      local_b8.content = Box::GetSize(pBVar9,Border);
      uVar2 = *(undefined4 *)local_108._0_8_;
      local_108._0_4_ = uVar2;
      pBVar9 = Element::GetBox(pSVar1->element);
      fVar14 = Box::GetEdge(pBVar9,Margin,edge_00);
      *pfVar11 = (local_118._0_4_ - (fVar14 + (float)local_108._0_4_)) + *pfVar11;
      pBVar9 = Element::GetBox(pSVar1->element);
      fVar14 = Box::GetEdge(pBVar9,Margin,edge);
      this = local_c0;
      *(float *)(local_80 + uVar13 * 4) = fVar14 + *(float *)(local_80 + uVar13 * 4);
      Element::SetOffset(pSVar1->element,(Vector2f)local_80._0_8_,local_c0->element,true);
      auVar10 = local_e8;
    }
    pVVar12 = (Vector2f *)&local_120.y;
    pfVar11 = (float *)(local_80 + 4);
    pBVar9 = (Box *)&local_b8.content.y;
    uVar13 = 1;
    bVar7 = false;
  } while (bVar6);
  if ((this->scrollbars[0].enabled != false) && (this->scrollbars[1].enabled == true)) {
    CreateCorner(this);
    Box::Box(&local_b8);
    VVar5.y = (float)local_d8._0_4_;
    VVar5.x = (float)local_d8._0_4_;
    LayoutDetails::BuildBox(&local_b8,VVar5,this->corner,Block);
    _content.y = this->scrollbars[1].size;
    _content.x = this->scrollbars[0].size;
    Box::SetContent(&local_b8,_content);
    Element::SetBox(this->corner,&local_b8);
    pEVar4 = this->corner;
    VVar5 = Box::GetPosition(local_f0,Padding);
    unique0x100001dd = extraout_XMM0_Dc_00;
    local_e8._0_4_ = VVar5.x;
    local_e8._4_4_ = VVar5.y;
    unique0x100001e1 = extraout_XMM0_Dd_00;
    local_118 = *(Vector2f **)&this->scrollbars[0].size;
    uStack_110 = *(undefined8 *)((long)&this->scrollbars[1].element + 4);
    local_108 = ZEXT416((uint)this->scrollbars[1].size);
    VVar5 = Box::GetPosition(&local_b8,Margin);
    offset_00.y = (((float)local_e8._4_4_ + (float)local_d8._4_4_) - (float)local_108._0_4_) -
                  VVar5.y;
    offset_00.x = (((float)local_e8._0_4_ + (float)local_d8._0_4_) - local_118._0_4_) - VVar5.x;
    Element::SetOffset(pEVar4,offset_00,this->element,true);
    pEVar4 = this->corner;
    local_80._0_8_ = NONE;
    Variant::Set((Variant *)local_80,0);
    local_58._0_4_ = KEYWORD;
    local_58._4_4_ = -1;
    local_50 = (PropertyDefinition *)0x0;
    local_48 = -1;
    local_40 = (element_type *)0x0;
    _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Element::SetProperty(pEVar4,Visibility,(Property *)local_80);
    if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_38._M_pi);
    }
    Variant::~Variant((Variant *)local_80);
    Box::~Box(&local_b8);
  }
  return;
}

Assistant:

void ElementScroll::FormatScrollbars()
{
	const Box& element_box = element->GetBox();
	const Vector2f containing_block = element_box.GetSize(BoxArea::Padding);

	for (int i = 0; i < 2; i++)
	{
		if (!scrollbars[i].enabled)
			continue;

		if (i == VERTICAL)
		{
			scrollbars[i].widget->SetBarLength(element->GetClientHeight());
			scrollbars[i].widget->SetTrackLength(element->GetScrollHeight());

			float traversable_track = element->GetScrollHeight() - element->GetClientHeight();
			if (traversable_track > 0)
				scrollbars[i].widget->SetBarPosition(element->GetScrollTop() / traversable_track);
			else
				scrollbars[i].widget->SetBarPosition(0);
		}
		else
		{
			scrollbars[i].widget->SetBarLength(element->GetClientWidth());
			scrollbars[i].widget->SetTrackLength(element->GetScrollWidth());

			float traversable_track = element->GetScrollWidth() - element->GetClientWidth();
			if (traversable_track > 0)
				scrollbars[i].widget->SetBarPosition(element->GetScrollLeft() / traversable_track);
			else
				scrollbars[i].widget->SetBarPosition(0);
		}

		float slider_length = containing_block[1 - i];
		float user_scrollbar_margin = scrollbars[i].element->GetComputedValues().scrollbar_margin();
		float min_scrollbar_margin = GetScrollbarSize(i == VERTICAL ? HORIZONTAL : VERTICAL);
		slider_length -= Math::Max(user_scrollbar_margin, min_scrollbar_margin);

		scrollbars[i].widget->FormatElements(containing_block, slider_length);

		int variable_axis = i == VERTICAL ? 0 : 1;
		Vector2f offset = element_box.GetPosition(BoxArea::Padding);
		offset[variable_axis] += containing_block[variable_axis] -
			(scrollbars[i].element->GetBox().GetSize(BoxArea::Border)[variable_axis] +
				scrollbars[i].element->GetBox().GetEdge(BoxArea::Margin, i == VERTICAL ? BoxEdge::Right : BoxEdge::Bottom));
		// Add the top or left margin (as appropriate) onto the scrollbar's position.
		offset[1 - variable_axis] += scrollbars[i].element->GetBox().GetEdge(BoxArea::Margin, i == VERTICAL ? BoxEdge::Top : BoxEdge::Left);
		scrollbars[i].element->SetOffset(offset, element, true);
	}

	// Format the corner, if it is necessary.
	if (scrollbars[0].enabled && scrollbars[1].enabled)
	{
		CreateCorner();

		Box corner_box;
		LayoutDetails::BuildBox(corner_box, Vector2f(containing_block.x), corner);

		corner_box.SetContent(Vector2f(scrollbars[VERTICAL].size, scrollbars[HORIZONTAL].size));
		corner->SetBox(corner_box);
		corner->SetOffset(containing_block + element_box.GetPosition(BoxArea::Padding) -
				Vector2f(scrollbars[VERTICAL].size, scrollbars[HORIZONTAL].size) - corner_box.GetPosition(BoxArea::Margin),
			element, true);

		corner->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Visible));
	}
}